

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O3

void __thiscall
icu_63::SimpleTimeZone::setEndRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,int32_t time,
          TimeMode mode,UBool after,UErrorCode *status)

{
  char cVar1;
  
  this->endMonth = (int8_t)month;
  cVar1 = -(char)dayOfMonth;
  if (after != '\0') {
    cVar1 = (char)dayOfMonth;
  }
  this->endDay = cVar1;
  this->endDayOfWeek = -(char)dayOfWeek;
  this->endTime = time;
  this->endTimeMode = mode;
  decodeEndRule(this,status);
  this->transitionRulesInitialized = '\0';
  return;
}

Assistant:

void 
SimpleTimeZone::setEndRule(int32_t month, int32_t dayOfMonth, int32_t dayOfWeek, 
                           int32_t time, TimeMode mode, UBool after, UErrorCode& status)
{
    setEndRule(month, after ? dayOfMonth : -dayOfMonth,
               -dayOfWeek, time, mode, status);
}